

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivfenc.c
# Opt level: O1

void ivf_write_frame_header(FILE *outfile,int64_t pts,size_t frame_size)

{
  char header [12];
  undefined1 local_c;
  undefined1 local_b;
  undefined1 local_a;
  undefined1 local_9;
  undefined1 local_8;
  undefined1 local_7;
  undefined1 local_6;
  undefined1 local_5;
  undefined1 local_4;
  undefined1 local_3;
  undefined1 local_2;
  undefined1 local_1;
  
  local_c = (undefined1)frame_size;
  local_b = (undefined1)(frame_size >> 8);
  local_a = (undefined1)(frame_size >> 0x10);
  local_9 = (undefined1)(frame_size >> 0x18);
  local_8 = (undefined1)pts;
  local_7 = (undefined1)((ulong)pts >> 8);
  local_6 = (undefined1)((ulong)pts >> 0x10);
  local_5 = (undefined1)((ulong)pts >> 0x18);
  local_4 = (undefined1)((ulong)pts >> 0x20);
  local_3 = (undefined1)((ulong)pts >> 0x28);
  local_2 = (undefined1)((ulong)pts >> 0x30);
  local_1 = (undefined1)((ulong)pts >> 0x38);
  fwrite(&local_c,1,0xc,(FILE *)outfile);
  return;
}

Assistant:

void ivf_write_frame_header(FILE *outfile, int64_t pts, size_t frame_size) {
  char header[12];

  mem_put_le32(header, (int)frame_size);
  mem_put_le32(header + 4, (int)(pts & 0xFFFFFFFF));
  mem_put_le32(header + 8, (int)(pts >> 32));
  fwrite(header, 1, 12, outfile);
}